

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BumpAllocator *this;
  DistWeightSyntax *args_1;
  DistItemSyntax *pDVar1;
  BumpAllocator *in_stack_ffffffffffffffc8;
  DistWeightSyntax *in_stack_ffffffffffffffd0;
  
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x591226);
  this = (BumpAllocator *)
         deepClone<slang::syntax::ExpressionSyntax>
                   ((ExpressionSyntax *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (*(long *)(__fn + 0x20) == 0) {
    args_1 = (DistWeightSyntax *)0x0;
  }
  else {
    args_1 = deepClone<slang::syntax::DistWeightSyntax>
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DistItemSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::DistWeightSyntax*>
                     (this,(ExpressionSyntax *)__child_stack,(DistWeightSyntax **)args_1);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DistItemSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DistItemSyntax>(
        *deepClone<ExpressionSyntax>(*node.range, alloc),
        node.weight ? deepClone(*node.weight, alloc) : nullptr
    );
}